

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

void __thiscall calculator::error::~error(error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__error_001866d8;
  pcVar2 = (this->expr_)._M_dataplus._M_p;
  paVar1 = &(this->expr_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  operator_delete(this,0x30);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }